

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall QWidgetPrivate::closestParentWidgetWithWindowHandle(QWidgetPrivate *this)

{
  QWindow *pQVar1;
  QWidgetPrivate *in_RDI;
  bool bVar2;
  QWidget *parent;
  QWidget *q;
  uint7 in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  q_func(in_RDI);
  local_18 = QWidget::parentWidget((QWidget *)0x35e656);
  while( true ) {
    bVar2 = false;
    if (local_18 != (QWidget *)0x0) {
      pQVar1 = QWidget::windowHandle((QWidget *)(ulong)in_stack_ffffffffffffffe0);
      bVar2 = pQVar1 == (QWindow *)0x0;
    }
    if (!bVar2) break;
    local_18 = QWidget::parentWidget((QWidget *)0x35e694);
  }
  return local_18;
}

Assistant:

QWidget *QWidgetPrivate::closestParentWidgetWithWindowHandle() const
{
    Q_Q(const QWidget);
    QWidget *parent = q->parentWidget();
    while (parent && !parent->windowHandle())
        parent = parent->parentWidget();
    return parent;
}